

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::ConstPixelBufferAccess::sample2DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,float t
          ,IVec3 *offset)

{
  WrapMode WVar1;
  int iVar2;
  WrapMode WVar3;
  int i;
  TextureChannelClass TVar4;
  uint uVar5;
  uint uVar6;
  TextureChannelClass TVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Sampler *sampler_00;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  uint in_XMM2_Db;
  uint uVar21;
  uint in_XMM2_Dc;
  uint uVar22;
  uint in_XMM2_Dd;
  float fVar23;
  float fVar24;
  float fVar25;
  Vector<float,_4> res_6;
  Vec4 p01Clr;
  Vec4 p10Clr;
  Vec4 p00Clr;
  uint local_fc;
  tcu local_d8 [16];
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  TextureChannelClass local_ac;
  IVec3 *local_a8;
  Sampler *local_a0;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  TextureFormat local_48;
  int aiStack_40 [2];
  void *local_38;
  
  local_c8 = t;
  uStack_c4 = in_XMM2_Db;
  uStack_c0 = in_XMM2_Dc;
  uStack_bc = in_XMM2_Dd;
  local_88 = ref;
  TVar4 = getTextureChannelClass((this->m_format).type);
  fVar23 = s;
  uVar21 = in_XMM1_Db;
  uVar22 = in_XMM1_Dc;
  uVar5 = in_XMM1_Dd;
  fVar18 = local_c8;
  if (sampler->normalizedCoords == true) {
    WVar1 = sampler->wrapS;
    fVar23 = 0.0;
    uVar21 = 0;
    uVar22 = 0;
    uVar5 = 0;
    if (WVar1 < WRAPMODE_LAST) {
      fVar23 = (float)(this->m_size).m_data[0];
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar18 = floorf(s);
          fVar23 = (s - fVar18) * fVar23;
          uVar21 = in_XMM1_Db;
          uVar22 = in_XMM1_Dc;
          uVar5 = in_XMM1_Dd;
        }
        else {
          local_a8 = (IVec3 *)CONCAT44(local_a8._4_4_,s * 0.5);
          fVar18 = floorf(s * 0.5);
          fVar18 = local_a8._0_4_ - fVar18;
          if ((fVar18 != 0.5) || (NAN(fVar18))) {
            fVar19 = floorf(local_a8._0_4_ + 0.5);
          }
          else {
            fVar19 = 0.0;
            if (((long)(local_a8._0_4_ - fVar18) & 1U) != 0) {
              fVar19 = 1.0;
            }
            fVar19 = (local_a8._0_4_ - fVar18) + fVar19;
          }
          fVar18 = s - (fVar19 + fVar19);
          uVar17 = -(uint)(-fVar18 <= fVar18);
          uVar21 = in_XMM1_Db & (in_XMM1_Db ^ 0x80000000);
          uVar22 = in_XMM1_Dc & (in_XMM1_Dc ^ 0x80000000);
          uVar5 = in_XMM1_Dd & (in_XMM1_Dd ^ 0x80000000);
          fVar23 = (float)(~uVar17 & (uint)-fVar18 | (uint)fVar18 & uVar17) * fVar23;
        }
      }
      else {
        fVar23 = fVar23 * s;
        uVar21 = 0;
        uVar22 = 0;
        uVar5 = 0;
      }
    }
    WVar1 = sampler->wrapT;
    if (WVar1 < WRAPMODE_LAST) {
      fVar18 = (float)(this->m_size).m_data[1];
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        local_98 = fVar23;
        uStack_94 = uVar21;
        uStack_90 = uVar22;
        uStack_8c = uVar5;
        if (WVar1 == REPEAT_CL) {
          fVar19 = floorf(local_c8);
          fVar23 = local_98;
          uVar21 = uStack_94;
          uVar22 = uStack_90;
          uVar5 = uStack_8c;
          fVar18 = (local_c8 - fVar19) * fVar18;
        }
        else {
          fVar23 = local_c8 * 0.5;
          fVar19 = floorf(fVar23);
          fVar19 = fVar23 - fVar19;
          if ((fVar19 != 0.5) || (NAN(fVar19))) {
            fVar20 = floorf(fVar23 + 0.5);
          }
          else {
            fVar20 = 0.0;
            if (((long)(fVar23 - fVar19) & 1U) != 0) {
              fVar20 = 1.0;
            }
            fVar20 = (fVar23 - fVar19) + fVar20;
          }
          fVar19 = local_c8 - (fVar20 + fVar20);
          uVar17 = -(uint)(-fVar19 <= fVar19);
          uStack_c4 = uStack_c4 & (uStack_c4 ^ 0x80000000);
          uStack_c0 = uStack_c0 & (uStack_c0 ^ 0x80000000);
          uStack_bc = uStack_bc & (uStack_bc ^ 0x80000000);
          fVar23 = local_98;
          uVar21 = uStack_94;
          uVar22 = uStack_90;
          uVar5 = uStack_8c;
          fVar18 = (float)(~uVar17 & (uint)-fVar19 | (uint)fVar19 & uVar17) * fVar18;
        }
      }
      else {
        fVar18 = local_c8 * fVar18;
      }
    }
    else {
      uStack_c4 = 0;
      uStack_c0 = 0;
      uStack_bc = 0;
      fVar18 = 0.0;
    }
  }
  if (filter != LINEAR) {
    if (filter != NEAREST) {
      return 0.0;
    }
    sampleNearest2D(local_d8,this,sampler,fVar23,fVar18,offset);
    fVar23 = *(float *)(local_d8 + (long)sampler->compareChannel * 4);
    if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar18 = 1.0;
      if (fVar23 <= 1.0) {
        fVar18 = fVar23;
      }
      fVar23 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar18);
    }
    if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar18 = 1.0;
      if (local_88 <= 1.0) {
        fVar18 = local_88;
      }
      local_88 = (float)(~-(uint)(local_88 < 0.0) & (uint)fVar18);
    }
    switch(sampler->compare) {
    case COMPAREMODE_LESS:
      bVar15 = fVar23 < local_88;
      goto LAB_001ebaa3;
    case COMPAREMODE_LESS_OR_EQUAL:
      bVar15 = fVar23 < local_88;
      goto LAB_001ebaca;
    case COMPAREMODE_GREATER:
      bVar15 = local_88 < fVar23;
LAB_001ebaa3:
      bVar15 = !bVar15 && local_88 != fVar23;
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      bVar15 = local_88 < fVar23;
LAB_001ebaca:
      bVar15 = !bVar15;
      break;
    case COMPAREMODE_EQUAL:
      bVar15 = local_88 == fVar23;
      break;
    case COMPAREMODE_NOT_EQUAL:
      bVar15 = local_88 != fVar23;
      break;
    case COMPAREMODE_ALWAYS:
      bVar15 = true;
      break;
    default:
      bVar15 = false;
    }
    if (!bVar15) {
      return 0.0;
    }
    return 1.0;
  }
  uVar17 = (this->m_size).m_data[0];
  local_38 = (void *)(ulong)(uint)(this->m_size).m_data[1];
  local_98 = fVar23 + -0.5;
  local_c8 = fVar18;
  local_ac = TVar4;
  uStack_94 = uVar21;
  uStack_90 = uVar22;
  uStack_8c = uVar5;
  fVar23 = floorf(local_98);
  iVar9 = offset->m_data[0];
  iVar2 = offset->m_data[1];
  local_c8 = local_c8 + -0.5;
  fVar18 = floorf(local_c8);
  WVar1 = sampler->wrapS;
  local_fc = 0;
  uVar21 = 0;
  if (WVar1 < WRAPMODE_LAST) {
    uVar22 = iVar9 + (int)fVar23;
    uVar21 = uVar22;
    switch(WVar1) {
    default:
      uVar5 = uVar17 - 1;
      if ((int)uVar22 < (int)(uVar17 - 1)) {
        uVar5 = uVar22;
      }
      uVar21 = 0;
      if (-1 < (int)uVar22) {
        uVar21 = uVar5;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar5 = uVar17;
      if ((int)uVar22 < (int)uVar17) {
        uVar5 = uVar22;
      }
      uVar21 = 0xffffffff;
      if (-2 < (int)uVar22) {
        uVar21 = uVar5;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar21 = ((int)uVar22 % (int)uVar17 >> 0x1f & uVar17) + (int)uVar22 % (int)uVar17;
      break;
    case MIRRORED_ONCE:
      uVar21 = uVar17;
      if ((int)uVar22 < (int)uVar17) {
        uVar21 = uVar22;
      }
      if (SBORROW4(uVar22,-uVar17) != (int)(uVar22 + uVar17) < 0) {
        uVar21 = -uVar17;
      }
    case MIRRORED_REPEAT_GL:
      iVar10 = (int)uVar21 % (int)(uVar17 * 2);
      uVar21 = (iVar10 - uVar17) + (iVar10 >> 0x1f & uVar17 * 2);
      uVar21 = ~((int)uVar21 >> 0x1f ^ uVar21) + uVar17;
    }
  }
  if (WVar1 < WRAPMODE_LAST) {
    uVar5 = iVar9 + (int)fVar23 + 1;
    uVar22 = uVar5;
    switch(WVar1) {
    default:
      uVar22 = uVar17 - 1;
      if ((int)uVar5 < (int)(uVar17 - 1)) {
        uVar22 = uVar5;
      }
      local_fc = 0;
      if (-1 < (int)uVar5) {
        local_fc = uVar22;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar22 = uVar17;
      if ((int)uVar5 < (int)uVar17) {
        uVar22 = uVar5;
      }
      local_fc = 0xffffffff;
      if (-2 < (int)uVar5) {
        local_fc = uVar22;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      local_fc = ((int)uVar5 % (int)uVar17 >> 0x1f & uVar17) + (int)uVar5 % (int)uVar17;
      break;
    case MIRRORED_ONCE:
      uVar22 = uVar17;
      if ((int)uVar5 < (int)uVar17) {
        uVar22 = uVar5;
      }
      if (SBORROW4(uVar5,-uVar17) != (int)(uVar5 + uVar17) < 0) {
        uVar22 = -uVar17;
      }
    case MIRRORED_REPEAT_GL:
      iVar9 = (int)uVar22 % (int)(uVar17 * 2);
      uVar22 = (iVar9 - uVar17) + (iVar9 >> 0x1f & uVar17 * 2);
      local_fc = ~((int)uVar22 >> 0x1f ^ uVar22) + uVar17;
    }
  }
  WVar3 = sampler->wrapT;
  uVar5 = (uint)local_38;
  uVar22 = 0;
  if (WVar3 < WRAPMODE_LAST) {
    uVar12 = iVar2 + (int)fVar18;
    uVar22 = uVar12;
    switch(WVar3) {
    default:
      uVar6 = uVar5 - 1;
      if ((int)uVar12 < (int)(uVar5 - 1)) {
        uVar6 = uVar12;
      }
      uVar22 = 0;
      if (-1 < (int)uVar12) {
        uVar22 = uVar6;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar6 = uVar5;
      if ((int)uVar12 < (int)uVar5) {
        uVar6 = uVar12;
      }
      uVar22 = 0xffffffff;
      if (-2 < (int)uVar12) {
        uVar22 = uVar6;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar22 = ((int)uVar12 % (int)uVar5 >> 0x1f & uVar5) + (int)uVar12 % (int)uVar5;
      break;
    case MIRRORED_ONCE:
      uVar22 = uVar5;
      if ((int)uVar12 < (int)uVar5) {
        uVar22 = uVar12;
      }
      if (SBORROW4(uVar12,-uVar5) != (int)(uVar12 + uVar5) < 0) {
        uVar22 = -uVar5;
      }
    case MIRRORED_REPEAT_GL:
      iVar9 = (int)uVar22 % (int)(uVar5 * 2);
      uVar22 = (iVar9 - uVar5) + (iVar9 >> 0x1f & uVar5 * 2);
      uVar22 = ~((int)uVar22 >> 0x1f ^ uVar22) + uVar5;
    }
  }
  uVar12 = 0;
  if (WVar3 < WRAPMODE_LAST) {
    uVar6 = iVar2 + (int)fVar18 + 1;
    uVar12 = uVar6;
    switch(WVar3) {
    default:
      uVar11 = uVar5 - 1;
      if ((int)uVar6 < (int)(uVar5 - 1)) {
        uVar11 = uVar6;
      }
      uVar12 = 0;
      if (-1 < (int)uVar6) {
        uVar12 = uVar11;
      }
      break;
    case CLAMP_TO_BORDER:
      uVar11 = uVar5;
      if ((int)uVar6 < (int)uVar5) {
        uVar11 = uVar6;
      }
      uVar12 = 0xffffffff;
      if (-2 < (int)uVar6) {
        uVar12 = uVar11;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar12 = ((int)uVar6 % (int)uVar5 >> 0x1f & uVar5) + (int)uVar6 % (int)uVar5;
      break;
    case MIRRORED_ONCE:
      uVar12 = uVar5;
      if ((int)uVar6 < (int)uVar5) {
        uVar12 = uVar6;
      }
      if (SBORROW4(uVar6,-uVar5) != (int)(uVar6 + uVar5) < 0) {
        uVar12 = -uVar5;
      }
    case MIRRORED_REPEAT_GL:
      iVar9 = (int)uVar12 % (int)(uVar5 * 2);
      uVar12 = (iVar9 - uVar5) + (iVar9 >> 0x1f & uVar5 * 2);
      uVar12 = ~((int)uVar12 >> 0x1f ^ uVar12) + uVar5;
    }
  }
  bVar15 = WVar1 == CLAMP_TO_BORDER;
  bVar16 = WVar3 == CLAMP_TO_BORDER;
  iVar9 = (int)this;
  local_a8 = offset;
  local_a0 = sampler;
  if ((((int)uVar17 <= (int)uVar21 || (int)uVar21 < 0) && bVar15) ||
     (((int)uVar5 <= (int)uVar22 || (int)uVar22 < 0) && bVar16)) {
    TVar4 = getTextureChannelClass((this->m_format).type);
    switch(TVar4) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)&local_48,&this->m_format,local_a0);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_d8,&this->m_format,local_a0);
      local_48.order = R;
      local_48.type = SNORM_INT8;
      aiStack_40[0] = 0;
      aiStack_40[1] = 0;
      lVar8 = 0;
      do {
        (&local_48.order)[lVar8] = (ChannelOrder)(float)*(int *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_d8,&this->m_format,local_a0);
      local_48.order = R;
      local_48.type = SNORM_INT8;
      aiStack_40[0] = 0;
      aiStack_40[1] = 0;
      lVar8 = 0;
      do {
        (&local_48.order)[lVar8] = (ChannelOrder)(float)*(uint *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    default:
      lVar8 = 0;
      do {
        (&local_48.order)[lVar8] = 0xbf800000;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
  }
  else {
    lookup((ConstPixelBufferAccess *)&local_48,iVar9,uVar21,uVar22);
  }
  if (((int)uVar5 > (int)uVar22 && (int)uVar22 >= 0 || !bVar16) &&
      ((int)local_fc < (int)uVar17 && -1 < (int)local_fc || !bVar15)) {
    lookup((ConstPixelBufferAccess *)local_58,iVar9,local_fc,uVar22);
    sampler_00 = local_a0;
  }
  else {
    TVar4 = getTextureChannelClass((this->m_format).type);
    sampler_00 = local_a0;
    switch(TVar4) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_58,&this->m_format,local_a0);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_d8,&this->m_format,local_a0);
      local_58._0_4_ = R;
      local_58._4_4_ = SNORM_INT8;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_58 + lVar8 * 4) = (float)*(int *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_d8,&this->m_format,local_a0);
      local_58._0_4_ = R;
      local_58._4_4_ = SNORM_INT8;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_58 + lVar8 * 4) = (float)*(uint *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    default:
      lVar8 = 0;
      do {
        *(undefined4 *)(local_58 + lVar8 * 4) = 0xbf800000;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
  }
  if (((int)uVar17 > (int)uVar21 && (int)uVar21 >= 0 || !bVar15) &&
      (!bVar16 || (int)uVar12 < (int)uVar5 && -1 < (int)uVar12)) {
    lookup((ConstPixelBufferAccess *)local_68,iVar9,uVar21,uVar12);
  }
  else {
    TVar4 = getTextureChannelClass((this->m_format).type);
    switch(TVar4) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_68,&this->m_format,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_d8,&this->m_format,sampler_00);
      local_68._0_4_ = R;
      local_68._4_4_ = SNORM_INT8;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_68 + lVar8 * 4) = (float)*(int *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_d8,&this->m_format,sampler_00);
      local_68._0_4_ = R;
      local_68._4_4_ = SNORM_INT8;
      local_68._8_4_ = 0;
      local_68._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_68 + lVar8 * 4) = (float)*(uint *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    default:
      lVar8 = 0;
      do {
        *(undefined4 *)(local_68 + lVar8 * 4) = 0xbf800000;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
  }
  if (((int)local_fc < (int)uVar17 && -1 < (int)local_fc || !bVar15) &&
      (!bVar16 || (int)uVar12 < (int)uVar5 && -1 < (int)uVar12)) {
    lookup((ConstPixelBufferAccess *)local_78,iVar9,local_fc,uVar12);
    TVar4 = local_ac;
  }
  else {
    TVar7 = getTextureChannelClass((this->m_format).type);
    TVar4 = local_ac;
    switch(TVar7) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((tcu *)local_78,&this->m_format,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_d8,&this->m_format,sampler_00);
      local_78._0_4_ = R;
      local_78._4_4_ = SNORM_INT8;
      local_78._8_4_ = 0;
      local_78._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_78 + lVar8 * 4) = (float)*(int *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_d8,&this->m_format,sampler_00);
      local_78._0_4_ = R;
      local_78._4_4_ = SNORM_INT8;
      local_78._8_4_ = 0;
      local_78._12_4_ = 0;
      lVar8 = 0;
      do {
        *(float *)(local_78 + lVar8 * 4) = (float)*(uint *)(local_d8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      break;
    default:
      lVar8 = 0;
      do {
        *(undefined4 *)(local_78 + lVar8 * 4) = 0xbf800000;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
  }
  lVar8 = (long)sampler_00->compareChannel;
  fVar19 = (float)(&local_48.order)[lVar8];
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (fVar19 <= 1.0) {
      fVar20 = fVar19;
    }
    fVar19 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar20);
  }
  fVar20 = local_88;
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (local_88 <= 1.0) {
      fVar20 = local_88;
    }
    fVar20 = (float)(~-(uint)(local_88 < 0.0) & (uint)fVar20);
  }
  iVar9 = sampler_00->compare - COMPAREMODE_LESS;
  switch(iVar9) {
  case 0:
    bVar15 = fVar19 < fVar20;
    goto LAB_001ec1eb;
  case 1:
    bVar15 = fVar19 < fVar20;
    goto LAB_001ec1fc;
  case 2:
    bVar15 = fVar20 < fVar19;
LAB_001ec1eb:
    bVar15 = !bVar15 && fVar20 != fVar19;
    break;
  case 3:
    bVar15 = fVar20 < fVar19;
LAB_001ec1fc:
    bVar15 = !bVar15;
    break;
  case 4:
    bVar15 = fVar20 == fVar19;
    break;
  case 5:
    bVar15 = fVar20 != fVar19;
    break;
  case 6:
    bVar15 = true;
    break;
  default:
    bVar15 = false;
  }
  fVar19 = *(float *)(local_58 + lVar8 * 4);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (fVar19 <= 1.0) {
      fVar20 = fVar19;
    }
    fVar19 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar20);
  }
  fVar20 = local_88;
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (local_88 <= 1.0) {
      fVar20 = local_88;
    }
    fVar20 = (float)(~-(uint)(local_88 < 0.0) & (uint)fVar20);
  }
  switch(iVar9) {
  case 0:
    bVar16 = fVar19 < fVar20;
    goto LAB_001ec27c;
  case 1:
    bVar16 = fVar19 < fVar20;
    goto LAB_001ec28e;
  case 2:
    bVar16 = fVar20 < fVar19;
LAB_001ec27c:
    bVar16 = !bVar16 && fVar20 != fVar19;
    break;
  case 3:
    bVar16 = fVar20 < fVar19;
LAB_001ec28e:
    bVar16 = !bVar16;
    break;
  case 4:
    bVar16 = fVar20 == fVar19;
    break;
  case 5:
    bVar16 = fVar20 != fVar19;
    break;
  case 6:
    bVar16 = true;
    break;
  default:
    bVar16 = false;
  }
  fVar19 = *(float *)(local_68 + lVar8 * 4);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (fVar19 <= 1.0) {
      fVar20 = fVar19;
    }
    fVar19 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar20);
  }
  fVar20 = local_88;
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (local_88 <= 1.0) {
      fVar20 = local_88;
    }
    fVar20 = (float)(~-(uint)(local_88 < 0.0) & (uint)fVar20);
  }
  switch(iVar9) {
  case 0:
    bVar13 = fVar19 < fVar20;
    goto LAB_001ec311;
  case 1:
    bVar13 = fVar19 < fVar20;
    goto LAB_001ec323;
  case 2:
    bVar13 = fVar20 < fVar19;
LAB_001ec311:
    bVar13 = !bVar13 && fVar20 != fVar19;
    break;
  case 3:
    bVar13 = fVar20 < fVar19;
LAB_001ec323:
    bVar13 = !bVar13;
    break;
  case 4:
    bVar13 = fVar20 == fVar19;
    break;
  case 5:
    bVar13 = fVar20 != fVar19;
    break;
  case 6:
    bVar13 = true;
    break;
  default:
    bVar13 = false;
  }
  fVar19 = *(float *)(local_78 + lVar8 * 4);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (fVar19 <= 1.0) {
      fVar20 = fVar19;
    }
    fVar19 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar20);
  }
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar20 = 1.0;
    if (local_88 <= 1.0) {
      fVar20 = local_88;
    }
    local_88 = (float)(~-(uint)(local_88 < 0.0) & (uint)fVar20);
  }
  switch(iVar9) {
  case 0:
    bVar14 = fVar19 < local_88;
    goto LAB_001ec39f;
  case 1:
    bVar14 = fVar19 < local_88;
    goto LAB_001ec3b0;
  case 2:
    bVar14 = local_88 < fVar19;
LAB_001ec39f:
    bVar14 = !bVar14 && local_88 != fVar19;
    break;
  case 3:
    bVar14 = local_88 < fVar19;
LAB_001ec3b0:
    bVar14 = !bVar14;
    break;
  case 4:
    bVar14 = local_88 == fVar19;
    break;
  case 5:
    bVar14 = local_88 != fVar19;
    break;
  case 6:
    bVar14 = true;
    break;
  default:
    bVar14 = false;
  }
  fVar20 = 1.0;
  fVar19 = fVar20;
  if (!bVar13) {
    fVar19 = 0.0;
  }
  fVar24 = 1.0;
  if (!bVar16) {
    fVar24 = 0.0;
  }
  fVar25 = fVar20;
  if (!bVar15) {
    fVar25 = 0.0;
  }
  local_c8 = local_c8 - fVar18;
  local_98 = local_98 - fVar23;
  if (!bVar14) {
    fVar20 = 0.0;
  }
  return fVar20 * local_98 * local_c8 +
         (1.0 - local_98) * fVar19 * local_c8 +
         (1.0 - local_c8) * fVar25 * (1.0 - local_98) + fVar24 * local_98 * (1.0 - local_c8);
}

Assistant:

float ConstPixelBufferAccess::sample2DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest2D(*this, sampler, u, v, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear2DCompare(*this, sampler, ref, u, v, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}